

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void discrete_dist_test_pdf<trng::zero_truncated_poisson_dist>(zero_truncated_poisson_dist *d)

{
  uint x;
  double dVar1;
  double local_e0;
  double local_d8;
  SourceLineInfo local_d0;
  double diff;
  StringRef local_b8;
  BinaryExpr<const_double_&,_const_double_&> local_a8;
  AssertionHandler catchAssertionHandler;
  
  x = 1;
  local_e0 = trng::zero_truncated_poisson_dist::cdf(d,1);
  while (local_e0 < 0.95) {
    if (1 < x) {
      dVar1 = trng::zero_truncated_poisson_dist::cdf(d,x - 1);
      local_e0 = local_e0 - dVar1;
    }
    dVar1 = trng::zero_truncated_poisson_dist::pdf(d,x);
    diff = local_e0 - dVar1;
    local_a8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x2602f7;
    local_a8.super_ITransientExpression.m_isBinaryExpression = true;
    local_a8.super_ITransientExpression.m_result = false;
    local_a8.super_ITransientExpression._10_6_ = 0;
    local_d0.file =
         "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
    ;
    local_d0.line = 0xeb;
    Catch::StringRef::StringRef(&local_b8,"diff < 128 * std::numeric_limits<double>::epsilon()");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_a8,&local_d0,local_b8,Normal);
    local_d0.file = (char *)&diff;
    local_d8 = 2.842170943040401e-14;
    Catch::ExprLhs<double_const&>::operator<
              (&local_a8,(ExprLhs<double_const&> *)&local_d0,&local_d8);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a8.super_ITransientExpression)
    ;
    Catch::ITransientExpression::~ITransientExpression(&local_a8.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    x = x + 1;
    local_e0 = trng::zero_truncated_poisson_dist::cdf(d,x);
  }
  return;
}

Assistant:

void discrete_dist_test_pdf(dist &d) {
  int i{d.min()};
  double P{d.cdf(i)};
  while (P < 0.95) {
    double p{P};
    if (i > d.min())
      p -= d.cdf(i - 1);
    const double diff{p - d.pdf(i)};
    REQUIRE(diff < 128 * std::numeric_limits<double>::epsilon());
    ++i;
    P = d.cdf(i);
  }
}